

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputfile.cpp
# Opt level: O1

void __thiscall OutputFile::~OutputFile(OutputFile *this)

{
  pointer pcVar1;
  long lVar2;
  undefined8 uVar3;
  
  std::ofstream::close();
  std::ifstream::close();
  this->network = (Network *)0x0;
  std::ifstream::~ifstream(&this->freader);
  uVar3 = _log;
  lVar2 = _VTT;
  *(long *)&this->fwriter = _VTT;
  *(undefined8 *)(&this->fwriter + *(long *)(lVar2 + -0x18)) = uVar3;
  std::filebuf::~filebuf((filebuf *)&this->field_0x28);
  std::ios_base::~ios_base((ios_base *)&this->field_0x118);
  pcVar1 = (this->fname)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->fname).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

OutputFile::~OutputFile()
{
    close();
}